

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O2

void __thiscall
btRigidBody::btRigidBody(btRigidBody *this,btRigidBodyConstructionInfo *constructionInfo)

{
  btCollisionObject::btCollisionObject(&this->super_btCollisionObject);
  (this->super_btCollisionObject)._vptr_btCollisionObject = (_func_int **)&PTR__btRigidBody_001f1b38
  ;
  (this->m_constraintRefs).m_ownsMemory = true;
  (this->m_constraintRefs).m_data = (btTypedConstraint **)0x0;
  (this->m_constraintRefs).m_size = 0;
  (this->m_constraintRefs).m_capacity = 0;
  setupRigidBody(this,constructionInfo);
  return;
}

Assistant:

btRigidBody::btRigidBody(const btRigidBody::btRigidBodyConstructionInfo& constructionInfo)
{
	setupRigidBody(constructionInfo);
}